

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O2

int sscal_(integer *n,real *sa,real *sx,integer *incx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = *n;
  if (0 < (int)uVar1) {
    uVar2 = *incx;
    if (0 < (int)uVar2) {
      if (uVar2 == 1) {
        if (uVar1 % 5 != 0) {
          for (uVar3 = 0; (ulong)uVar1 % 5 != uVar3; uVar3 = uVar3 + 1) {
            sx[uVar3] = *sa * sx[uVar3];
          }
          if ((int)uVar1 < 5) {
            return 0;
          }
        }
        for (uVar3 = (ulong)(uVar1 % 5 + 1); (int)uVar3 <= (int)uVar1; uVar3 = uVar3 + 5) {
          sx[uVar3 - 1] = *sa * sx[uVar3 - 1];
          sx[uVar3] = *sa * sx[uVar3];
          sx[uVar3 + 1] = *sa * sx[uVar3 + 1];
          sx[uVar3 + 2] = *sa * sx[uVar3 + 2];
          sx[uVar3 + 3] = *sa * sx[uVar3 + 3];
        }
      }
      else {
        for (iVar4 = 1; iVar4 <= (int)(uVar1 * uVar2); iVar4 = iVar4 + uVar2) {
          *sx = *sa * *sx;
          sx = sx + uVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

int sscal_(integer *n, real *sa, real *sx, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;

    /* Local variables */
    static integer i__, m, mp1, nincx;


/*
       scales a vector by a constant.
       uses unrolled loops for increment equal to 1.
       jack dongarra, linpack, 3/11/78.
       modified 3/93 to return if incx .le. 0.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sx;

    /* Function Body */
    if (*n <= 0 || *incx <= 0) {
	return 0;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    i__1 = nincx;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	sx[i__] = *sa * sx[i__];
/* L10: */
    }
    return 0;

/*
          code for increment equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__2 = m;
    for (i__ = 1; i__ <= i__2; ++i__) {
	sx[i__] = *sa * sx[i__];
/* L30: */
    }
    if (*n < 5) {
	return 0;
    }
L40:
    mp1 = m + 1;
    i__2 = *n;
    for (i__ = mp1; i__ <= i__2; i__ += 5) {
	sx[i__] = *sa * sx[i__];
	sx[i__ + 1] = *sa * sx[i__ + 1];
	sx[i__ + 2] = *sa * sx[i__ + 2];
	sx[i__ + 3] = *sa * sx[i__ + 3];
	sx[i__ + 4] = *sa * sx[i__ + 4];
/* L50: */
    }
    return 0;
}